

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_perf_sampler_data llama_perf_sampler(llama_sampler *chain)

{
  int *piVar1;
  long *in_RDI;
  llama_perf_sampler_data lVar2;
  llama_sampler_chain *ctx;
  llama_perf_sampler_data data;
  int local_24;
  long local_20;
  long *local_18;
  double local_10 [2];
  
  local_18 = in_RDI;
  memset(local_10,0,0x10);
  if ((local_18 != (long *)0x0) && ((llama_sampler_i *)*local_18 == &llama_sampler_chain_i)) {
    local_20 = local_18[1];
    local_10[0] = (double)*(long *)(local_20 + 0x20) * 0.001;
    local_24 = 0;
    piVar1 = std::max<int>(&local_24,(int *)(local_20 + 0x28));
    lVar2.n_sample = *piVar1;
    lVar2.t_sample_ms = local_10[0];
    lVar2._12_4_ = 0;
    return lVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0x9e8,
             "%s: invalid sampler passed - requires a sampler created with llama_sampler_chain_init()\n"
             ,"llama_perf_sampler");
}

Assistant:

struct llama_perf_sampler_data llama_perf_sampler(const struct llama_sampler * chain) {
    struct llama_perf_sampler_data data = {};

    if (chain == nullptr || chain->iface != &llama_sampler_chain_i) {
        GGML_ABORT("%s: invalid sampler passed - requires a sampler created with llama_sampler_chain_init()\n", __func__);
    }

    const auto * ctx = (const struct llama_sampler_chain *) chain->ctx;

    data.t_sample_ms = 1e-3 * ctx->t_sample_us;
    data.n_sample    = std::max(0, ctx->n_sample);

    return data;
}